

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::CheckPrototypesForAccessorOrNonWritableItem
               (RecyclableObject *instance,uint32 index,Var *setterValue,DescriptorFlags *flags,
               ScriptContext *scriptContext,BOOL skipPrototypeCheck)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  DescriptorFlags DVar4;
  undefined4 *puVar5;
  Type *pTVar6;
  
  if (setterValue == (Var *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x986,"(setterValue)","setterValue");
    if (!bVar2) goto LAB_00ab8083;
    *puVar5 = 0;
  }
  if (flags == (DescriptorFlags *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x987,"(flags)","flags");
    if (!bVar2) {
LAB_00ab8083:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  bVar2 = CheckIfObjectAndPrototypeChainHasOnlyWritableDataProperties(instance);
  uVar3 = 0;
  if (!bVar2) {
    pTVar6 = (instance->type).ptr;
    while (pTVar6->typeId != TypeIds_Null) {
      DVar4 = (*(instance->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x28])(instance,(ulong)index,setterValue,scriptContext)
      ;
      *flags = DVar4;
      if (DVar4 != None || skipPrototypeCheck != 0) break;
      instance = RecyclableObject::GetPrototype(instance);
      pTVar6 = (instance->type).ptr;
    }
    DVar4 = *flags;
    uVar3 = 1;
    if (((DVar4 & (Proxy|Accessor)) == None) && (uVar3 = 0, (DVar4 & Data) != None)) {
      uVar3 = (uint)((DVar4 & Writable) == None);
    }
  }
  return uVar3;
}

Assistant:

BOOL JavascriptOperators::CheckPrototypesForAccessorOrNonWritableItem(RecyclableObject* instance, uint32 index,
        Var* setterValue, DescriptorFlags *flags, ScriptContext* scriptContext, BOOL skipPrototypeCheck /* = FALSE */)
    {
        Assert(setterValue);
        Assert(flags);

        // Do a quick walk up the prototype chain to see if any of the prototypes has ever had ANY setter or non-writable property.
        if (CheckIfObjectAndPrototypeChainHasOnlyWritableDataProperties(instance))
        {
            return FALSE;
        }

        RecyclableObject* object = instance;
        while (!JavascriptOperators::IsNull(object))
        {
            *flags = object->GetItemSetter(index, setterValue, scriptContext);
            if (*flags != None || skipPrototypeCheck)
            {
                break;
            }
            object = object->GetPrototype();
        }

        return ((*flags & Accessor) == Accessor) || ((*flags & Proxy) == Proxy) || ((*flags & Data) == Data && (*flags & Writable) == None);
    }